

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsimd.c
# Opt level: O3

int jsimd_can_quantize(void)

{
  init_simd();
  return (int)(((byte)simd_support & 0x88) != 0);
}

Assistant:

GLOBAL(int)
jsimd_can_quantize(void)
{
  init_simd();

  /* The code is optimised for these values only */
  if (DCTSIZE != 8)
    return 0;
  if (sizeof(JCOEF) != 2)
    return 0;
  if (sizeof(DCTELEM) != 2)
    return 0;

  if (simd_support & JSIMD_AVX2)
    return 1;
  if (simd_support & JSIMD_SSE2)
    return 1;

  return 0;
}